

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFortranLexer.cxx
# Opt level: O0

void yyunput(int c,char *yy_bp,yyscan_t yyscanner)

{
  undefined4 uVar1;
  undefined1 *puVar2;
  ulong local_48;
  char *source;
  char *dest;
  int number_to_move;
  yyguts_t *yyg;
  char *yy_cp;
  yyscan_t yyscanner_local;
  char *yy_bp_local;
  int c_local;
  
  yyg = *(yyguts_t **)((long)yyscanner + 0x40);
  *(undefined1 *)&yyg->yyextra_r = *(undefined1 *)((long)yyscanner + 0x30);
  yyscanner_local = yy_bp;
  if (yyg < (yyguts_t *)
            (*(long *)(*(long *)(*(long *)((long)yyscanner + 0x28) +
                                *(long *)((long)yyscanner + 0x18) * 8) + 8) + 2U)) {
    local_48 = *(long *)(*(long *)(*(long *)((long)yyscanner + 0x28) +
                                  *(long *)((long)yyscanner + 0x18) * 8) + 8) +
               (long)(*(int *)((long)yyscanner + 0x34) + 2);
    source = (char *)(*(long *)(*(long *)(*(long *)((long)yyscanner + 0x28) +
                                         *(long *)((long)yyscanner + 0x18) * 8) + 8) +
                     (long)(*(int *)(*(long *)(*(long *)((long)yyscanner + 0x28) +
                                              *(long *)((long)yyscanner + 0x18) * 8) + 0x18) + 2));
    while (*(ulong *)(*(long *)(*(long *)((long)yyscanner + 0x28) +
                               *(long *)((long)yyscanner + 0x18) * 8) + 8) < local_48) {
      source[-1] = *(char *)(local_48 - 1);
      local_48 = local_48 - 1;
      source = source + -1;
    }
    yyg = (yyguts_t *)((long)&yyg->yyextra_r + (long)((int)source - (int)local_48));
    yyscanner_local = yy_bp + ((int)source - (int)local_48);
    uVar1 = *(undefined4 *)
             (*(long *)(*(long *)((long)yyscanner + 0x28) + *(long *)((long)yyscanner + 0x18) * 8) +
             0x18);
    *(undefined4 *)((long)yyscanner + 0x34) = uVar1;
    *(undefined4 *)
     (*(long *)(*(long *)((long)yyscanner + 0x28) + *(long *)((long)yyscanner + 0x18) * 8) + 0x1c) =
         uVar1;
    if (yyg < (yyguts_t *)
              (*(long *)(*(long *)(*(long *)((long)yyscanner + 0x28) +
                                  *(long *)((long)yyscanner + 0x18) * 8) + 8) + 2U)) {
      yy_fatal_error("flex scanner push-back overflow",yyscanner);
    }
  }
  puVar2 = (undefined1 *)((long)&yyg[-1].yy_more_len + 3);
  *(char *)((long)&yyg[-1].yy_more_len + 3) = (char)c;
  *(yyscan_t *)((long)yyscanner + 0x80) = yyscanner_local;
  *(undefined1 *)((long)yyscanner + 0x30) = *puVar2;
  *(undefined1 **)((long)yyscanner + 0x40) = puVar2;
  return;
}

Assistant:

static void yyunput (int c, char * yy_bp , yyscan_t yyscanner)
{
	char *yy_cp;
    struct yyguts_t * yyg = (struct yyguts_t*)yyscanner;

    yy_cp = yyg->yy_c_buf_p;

	/* undo effects of setting up yytext */
	*yy_cp = yyg->yy_hold_char;

	if ( yy_cp < YY_CURRENT_BUFFER_LVALUE->yy_ch_buf + 2 )
		{ /* need to shift things up to make room */
		/* +2 for EOB chars. */
		int number_to_move = yyg->yy_n_chars + 2;
		char *dest = &YY_CURRENT_BUFFER_LVALUE->yy_ch_buf[
					YY_CURRENT_BUFFER_LVALUE->yy_buf_size + 2];
		char *source =
				&YY_CURRENT_BUFFER_LVALUE->yy_ch_buf[number_to_move];

		while ( source > YY_CURRENT_BUFFER_LVALUE->yy_ch_buf )
			*--dest = *--source;

		yy_cp += (int) (dest - source);
		yy_bp += (int) (dest - source);
		YY_CURRENT_BUFFER_LVALUE->yy_n_chars =
			yyg->yy_n_chars = (int) YY_CURRENT_BUFFER_LVALUE->yy_buf_size;

		if ( yy_cp < YY_CURRENT_BUFFER_LVALUE->yy_ch_buf + 2 )
			YY_FATAL_ERROR( "flex scanner push-back overflow" );
		}

	*--yy_cp = (char) c;

	yyg->yytext_ptr = yy_bp;
	yyg->yy_hold_char = *yy_cp;
	yyg->yy_c_buf_p = yy_cp;
}